

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_private(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uchar *input,uchar *output)

{
  mbedtls_mpi *pmVar1;
  mbedtls_mpi *pmVar2;
  int iVar3;
  int iVar4;
  mbedtls_mpi *pmVar5;
  mbedtls_mpi T;
  mbedtls_mpi TP;
  mbedtls_mpi R;
  mbedtls_mpi DQ_blind;
  mbedtls_mpi DP_blind;
  mbedtls_mpi TQ;
  mbedtls_mpi check_result_blinded;
  mbedtls_mpi input_blinded;
  mbedtls_mpi Q1;
  mbedtls_mpi P1;
  mbedtls_mpi local_100;
  mbedtls_mpi *local_f0;
  mbedtls_mpi *local_e8;
  mbedtls_mpi local_e0;
  mbedtls_mpi *local_d0;
  mbedtls_mpi local_c8;
  mbedtls_mpi local_b8;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_98;
  mbedtls_mpi local_88;
  uchar *local_78;
  mbedtls_mpi local_70;
  mbedtls_mpi local_60;
  mbedtls_mpi local_50;
  mbedtls_mpi local_40;
  
  if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    return -0x4080;
  }
  iVar3 = rsa_check_context(ctx,1,(int)p_rng);
  if (iVar3 != 0) {
    return -0x4080;
  }
  local_78 = output;
  mbedtls_mpi_init(&local_100);
  mbedtls_mpi_init(&local_40);
  mbedtls_mpi_init(&local_50);
  mbedtls_mpi_init(&local_c8);
  mbedtls_mpi_init(&local_a8);
  mbedtls_mpi_init(&local_b8);
  mbedtls_mpi_init(&local_e0);
  mbedtls_mpi_init(&local_98);
  mbedtls_mpi_init(&local_60);
  mbedtls_mpi_init(&local_70);
  iVar3 = mbedtls_mpi_read_binary(&local_100,input,ctx->len);
  if (iVar3 != 0) goto LAB_0049acd1;
  pmVar5 = &ctx->N;
  iVar4 = mbedtls_mpi_cmp_mpi(&local_100,pmVar5);
  iVar3 = -4;
  if (-1 < iVar4) goto LAB_0049acd1;
  mbedtls_mpi_init(&local_88);
  pmVar1 = &ctx->Vf;
  pmVar2 = &ctx->Vi;
  if ((ctx->Vf).p == (mbedtls_mpi_uint *)0x0) {
    iVar4 = 0xc;
    local_f0 = pmVar2;
    local_d0 = pmVar5;
    do {
      if (iVar4 + -1 == 0) {
        iVar3 = -0x4480;
        goto LAB_0049acc4;
      }
      iVar3 = mbedtls_mpi_fill_random(pmVar1,ctx->len - 1,f_rng,p_rng);
      if (iVar3 != 0) goto LAB_0049acc4;
      iVar3 = mbedtls_mpi_fill_random(&local_88,ctx->len - 1,f_rng,p_rng);
      pmVar5 = local_f0;
      if (iVar3 != 0) goto LAB_0049acc4;
      local_e8 = (mbedtls_mpi *)CONCAT44(local_e8._4_4_,iVar4 + -1);
      iVar3 = mbedtls_mpi_mul_mpi(local_f0,pmVar1,&local_88);
      pmVar2 = local_d0;
      if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_mod_mpi(pmVar5,pmVar5,local_d0), iVar3 != 0))
      goto LAB_0049acc4;
      iVar3 = mbedtls_mpi_inv_mod(pmVar5,pmVar5,pmVar2);
      pmVar2 = local_f0;
      iVar4 = (int)local_e8;
    } while (iVar3 == -0xe);
    if (((iVar3 == 0) &&
        (iVar3 = mbedtls_mpi_mul_mpi(local_f0,local_f0,&local_88), pmVar5 = local_d0, iVar3 == 0))
       && (iVar3 = mbedtls_mpi_mod_mpi(pmVar2,pmVar2,local_d0), iVar3 == 0)) {
      iVar3 = mbedtls_mpi_exp_mod(local_f0,local_f0,&ctx->E,pmVar5,&ctx->RN);
      goto LAB_0049a8f9;
    }
  }
  else {
    iVar3 = mbedtls_mpi_mul_mpi(pmVar2,pmVar2,pmVar2);
    if (((iVar3 == 0) && (iVar3 = mbedtls_mpi_mod_mpi(pmVar2,pmVar2,pmVar5), iVar3 == 0)) &&
       (local_f0 = pmVar2, iVar3 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,pmVar1), iVar3 == 0)) {
      iVar3 = mbedtls_mpi_mod_mpi(pmVar1,pmVar1,pmVar5);
LAB_0049a8f9:
      mbedtls_mpi_free(&local_88);
      if (((iVar3 == 0) && (iVar3 = mbedtls_mpi_mul_mpi(&local_100,&local_100,local_f0), iVar3 == 0)
          ) && ((iVar3 = mbedtls_mpi_mod_mpi(&local_100,&local_100,pmVar5), iVar3 == 0 &&
                (local_e8 = pmVar1, iVar3 = mbedtls_mpi_copy(&local_60,&local_100), iVar3 == 0)))) {
        pmVar1 = &ctx->P;
        iVar3 = mbedtls_mpi_sub_int(&local_40,pmVar1,1);
        if (iVar3 == 0) {
          pmVar2 = &ctx->Q;
          iVar3 = mbedtls_mpi_sub_int(&local_50,pmVar2,1);
          if ((((((iVar3 == 0) &&
                 (iVar3 = mbedtls_mpi_fill_random(&local_c8,0x1c,f_rng,p_rng), iVar3 == 0)) &&
                (iVar3 = mbedtls_mpi_mul_mpi(&local_a8,&local_40,&local_c8), iVar3 == 0)) &&
               ((iVar3 = mbedtls_mpi_add_mpi(&local_a8,&local_a8,&ctx->DP), iVar3 == 0 &&
                (iVar3 = mbedtls_mpi_fill_random(&local_c8,0x1c,f_rng,p_rng), iVar3 == 0)))) &&
              ((((iVar3 = mbedtls_mpi_mul_mpi(&local_b8,&local_50,&local_c8), iVar3 == 0 &&
                 ((iVar3 = mbedtls_mpi_add_mpi(&local_b8,&local_b8,&ctx->DQ), iVar3 == 0 &&
                  (iVar3 = mbedtls_mpi_exp_mod(&local_e0,&local_100,&local_a8,pmVar1,&ctx->RP),
                  iVar3 == 0)))) &&
                (iVar3 = mbedtls_mpi_exp_mod(&local_98,&local_100,&local_b8,pmVar2,&ctx->RQ),
                iVar3 == 0)) &&
               ((((iVar3 = mbedtls_mpi_sub_mpi(&local_100,&local_e0,&local_98), iVar3 == 0 &&
                  (iVar3 = mbedtls_mpi_mul_mpi(&local_e0,&local_100,&ctx->QP), iVar3 == 0)) &&
                 (iVar3 = mbedtls_mpi_mod_mpi(&local_100,&local_e0,pmVar1), iVar3 == 0)) &&
                ((iVar3 = mbedtls_mpi_mul_mpi(&local_e0,&local_100,pmVar2), iVar3 == 0 &&
                 (iVar3 = mbedtls_mpi_add_mpi(&local_100,&local_98,&local_e0), iVar3 == 0)))))))) &&
             (iVar3 = mbedtls_mpi_exp_mod(&local_70,&local_100,&ctx->E,pmVar5,&ctx->RN), iVar3 == 0)
             ) {
            iVar4 = mbedtls_mpi_cmp_mpi(&local_70,&local_60);
            iVar3 = -0x4380;
            if ((iVar4 == 0) && (iVar3 = rsa_unblind(&local_100,local_e8,pmVar5), iVar3 == 0)) {
              iVar3 = mbedtls_mpi_write_binary(&local_100,local_78,ctx->len);
            }
          }
        }
      }
      goto LAB_0049acd1;
    }
  }
LAB_0049acc4:
  mbedtls_mpi_free(&local_88);
LAB_0049acd1:
  mbedtls_mpi_free(&local_40);
  mbedtls_mpi_free(&local_50);
  mbedtls_mpi_free(&local_c8);
  mbedtls_mpi_free(&local_a8);
  mbedtls_mpi_free(&local_b8);
  mbedtls_mpi_free(&local_100);
  mbedtls_mpi_free(&local_e0);
  mbedtls_mpi_free(&local_98);
  mbedtls_mpi_free(&local_70);
  mbedtls_mpi_free(&local_60);
  iVar4 = iVar3 + -0x4300;
  if (iVar3 < -0x7f) {
    iVar4 = iVar3;
  }
  if (iVar3 == 0) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

int mbedtls_rsa_private(mbedtls_rsa_context *ctx,
                        int (*f_rng)(void *, unsigned char *, size_t),
                        void *p_rng,
                        const unsigned char *input,
                        unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen;

    /* Temporary holding the result */
    mbedtls_mpi T;

    /* Temporaries holding P-1, Q-1 and the
     * exponent blinding factor, respectively. */
    mbedtls_mpi P1, Q1, R;

#if !defined(MBEDTLS_RSA_NO_CRT)
    /* Temporaries holding the results mod p resp. mod q. */
    mbedtls_mpi TP, TQ;

    /* Temporaries holding the blinded exponents for
     * the mod p resp. mod q computation (if used). */
    mbedtls_mpi DP_blind, DQ_blind;
#else
    /* Temporary holding the blinded exponent (if used). */
    mbedtls_mpi D_blind;
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Temporaries holding the initial input and the double
     * checked result; should be the same in the end. */
    mbedtls_mpi input_blinded, check_result_blinded;

    if (f_rng == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (rsa_check_context(ctx, 1 /* private key checks */,
                          1 /* blinding on        */) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_THREADING_C)
    if ((ret = mbedtls_mutex_lock(&ctx->mutex)) != 0) {
        return ret;
    }
#endif

    /* MPI Initialization */
    mbedtls_mpi_init(&T);

    mbedtls_mpi_init(&P1);
    mbedtls_mpi_init(&Q1);
    mbedtls_mpi_init(&R);

#if defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_init(&D_blind);
#else
    mbedtls_mpi_init(&DP_blind);
    mbedtls_mpi_init(&DQ_blind);
#endif

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_init(&TP); mbedtls_mpi_init(&TQ);
#endif

    mbedtls_mpi_init(&input_blinded);
    mbedtls_mpi_init(&check_result_blinded);

    /* End of MPI initialization */

    MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&T, input, ctx->len));
    if (mbedtls_mpi_cmp_mpi(&T, &ctx->N) >= 0) {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    /*
     * Blinding
     * T = T * Vi mod N
     */
    MBEDTLS_MPI_CHK(rsa_prepare_blinding(ctx, f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&T, &T, &ctx->Vi));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&T, &T, &ctx->N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&input_blinded, &T));

    /*
     * Exponent blinding
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&P1, &ctx->P, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&Q1, &ctx->Q, 1));

#if defined(MBEDTLS_RSA_NO_CRT)
    /*
     * D_blind = ( P - 1 ) * ( Q - 1 ) * R + D
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_fill_random(&R, RSA_EXPONENT_BLINDING,
                                            f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&D_blind, &P1, &Q1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&D_blind, &D_blind, &R));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&D_blind, &D_blind, &ctx->D));
#else
    /*
     * DP_blind = ( P - 1 ) * R + DP
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_fill_random(&R, RSA_EXPONENT_BLINDING,
                                            f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&DP_blind, &P1, &R));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&DP_blind, &DP_blind,
                                        &ctx->DP));

    /*
     * DQ_blind = ( Q - 1 ) * R + DQ
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_fill_random(&R, RSA_EXPONENT_BLINDING,
                                            f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&DQ_blind, &Q1, &R));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&DQ_blind, &DQ_blind,
                                        &ctx->DQ));
#endif /* MBEDTLS_RSA_NO_CRT */

#if defined(MBEDTLS_RSA_NO_CRT)
    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&T, &T, &D_blind, &ctx->N, &ctx->RN));
#else
    /*
     * Faster decryption using the CRT
     *
     * TP = input ^ dP mod P
     * TQ = input ^ dQ mod Q
     */

    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&TP, &T, &DP_blind, &ctx->P, &ctx->RP));
    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&TQ, &T, &DQ_blind, &ctx->Q, &ctx->RQ));

    /*
     * T = (TP - TQ) * (Q^-1 mod P) mod P
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&T, &TP, &TQ));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&TP, &T, &ctx->QP));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&T, &TP, &ctx->P));

    /*
     * T = TQ + T * Q
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&TP, &T, &ctx->Q));
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&T, &TQ, &TP));
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Verify the result to prevent glitching attacks. */
    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&check_result_blinded, &T, &ctx->E,
                                        &ctx->N, &ctx->RN));
    if (mbedtls_mpi_cmp_mpi(&check_result_blinded, &input_blinded) != 0) {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto cleanup;
    }

    /*
     * Unblind
     * T = T * Vf mod N
     */
    MBEDTLS_MPI_CHK(rsa_unblind(&T, &ctx->Vf, &ctx->N));

    olen = ctx->len;
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&T, output, olen));

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if (mbedtls_mutex_unlock(&ctx->mutex) != 0) {
        return MBEDTLS_ERR_THREADING_MUTEX_ERROR;
    }
#endif

    mbedtls_mpi_free(&P1);
    mbedtls_mpi_free(&Q1);
    mbedtls_mpi_free(&R);

#if defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_free(&D_blind);
#else
    mbedtls_mpi_free(&DP_blind);
    mbedtls_mpi_free(&DQ_blind);
#endif

    mbedtls_mpi_free(&T);

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_free(&TP); mbedtls_mpi_free(&TQ);
#endif

    mbedtls_mpi_free(&check_result_blinded);
    mbedtls_mpi_free(&input_blinded);

    if (ret != 0 && ret >= -0x007f) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_PRIVATE_FAILED, ret);
    }

    return ret;
}